

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::BufferComponentSizeCase::test
          (BufferComponentSizeCase *this)

{
  StateVerifier *pSVar1;
  TestContext *pTVar2;
  uint uVar3;
  RenderTarget *pRVar4;
  PixelFormat *pPVar5;
  BufferComponentSizeCase *this_local;
  
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  pPVar5 = tcu::RenderTarget::getPixelFormat(pRVar4);
  (*pSVar1->_vptr_StateVerifier[5])(pSVar1,pTVar2,0xd52,(ulong)(uint)pPVar5->redBits);
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  pPVar5 = tcu::RenderTarget::getPixelFormat(pRVar4);
  (*pSVar1->_vptr_StateVerifier[5])(pSVar1,pTVar2,0xd54,(ulong)(uint)pPVar5->blueBits);
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  pPVar5 = tcu::RenderTarget::getPixelFormat(pRVar4);
  (*pSVar1->_vptr_StateVerifier[5])(pSVar1,pTVar2,0xd53,(ulong)(uint)pPVar5->greenBits);
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  pPVar5 = tcu::RenderTarget::getPixelFormat(pRVar4);
  (*pSVar1->_vptr_StateVerifier[5])(pSVar1,pTVar2,0xd55,(ulong)(uint)pPVar5->alphaBits);
  ApiCase::expectError(&this->super_ApiCase,0);
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar3 = tcu::RenderTarget::getDepthBits(pRVar4);
  (*pSVar1->_vptr_StateVerifier[5])(pSVar1,pTVar2,0xd56,(ulong)uVar3);
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar3 = tcu::RenderTarget::getStencilBits(pRVar4);
  (*pSVar1->_vptr_StateVerifier[5])(pSVar1,pTVar2,0xd57,(ulong)uVar3);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, GL_RED_BITS,		m_context.getRenderTarget().getPixelFormat().redBits);
		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, GL_BLUE_BITS,	m_context.getRenderTarget().getPixelFormat().blueBits);
		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, GL_GREEN_BITS,	m_context.getRenderTarget().getPixelFormat().greenBits);
		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, GL_ALPHA_BITS,	m_context.getRenderTarget().getPixelFormat().alphaBits);
		expectError(GL_NO_ERROR);

		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, GL_DEPTH_BITS,	m_context.getRenderTarget().getDepthBits());
		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, GL_STENCIL_BITS,	m_context.getRenderTarget().getStencilBits());
		expectError(GL_NO_ERROR);
	}